

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O0

QString * unescapeHtml(QString *__return_storage_ptr__,QString *escaped)

{
  QLatin1String local_b0;
  QLatin1String local_a0;
  QLatin1String local_90;
  QLatin1String local_80;
  QLatin1String local_70;
  QLatin1String local_60 [2];
  QLatin1String local_40;
  QLatin1String local_30;
  undefined1 local_19;
  QString *local_18;
  QString *escaped_local;
  QString *unescaped;
  
  local_19 = 0;
  local_18 = escaped;
  escaped_local = __return_storage_ptr__;
  QString::QString(__return_storage_ptr__,escaped);
  QLatin1String::QLatin1String(&local_30,"&lt;");
  QLatin1String::QLatin1String(&local_40,"<");
  QString::replace((QLatin1String *)__return_storage_ptr__,(QLatin1String *)local_30.m_size,
                   (CaseSensitivity)local_30.m_data);
  QLatin1String::QLatin1String(local_60,"&gt;");
  QLatin1String::QLatin1String(&local_70,">");
  QString::replace((QLatin1String *)__return_storage_ptr__,(QLatin1String *)local_60[0].m_size,
                   (CaseSensitivity)local_60[0].m_data);
  QLatin1String::QLatin1String(&local_80,"&quot;");
  QLatin1String::QLatin1String(&local_90,"\"");
  QString::replace((QLatin1String *)__return_storage_ptr__,(QLatin1String *)local_80.m_size,
                   (CaseSensitivity)local_80.m_data);
  QLatin1String::QLatin1String(&local_a0,"&amp;");
  QLatin1String::QLatin1String(&local_b0,"&");
  QString::replace((QLatin1String *)__return_storage_ptr__,(QLatin1String *)local_a0.m_size,
                   (CaseSensitivity)local_a0.m_data);
  return __return_storage_ptr__;
}

Assistant:

QString unescapeHtml(const QString& escaped)
{
	QString unescaped(escaped);
	unescaped.replace(QLatin1String("&lt;"), QLatin1String("<"));
	unescaped.replace(QLatin1String("&gt;"), QLatin1String(">"));
	unescaped.replace(QLatin1String("&quot;"), QLatin1String("\""));
	unescaped.replace(QLatin1String("&amp;"), QLatin1String("&"));
	return unescaped;
}